

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [34],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1,
          char (*Args_2) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [2],uint *Args_5,char (*Args_6) [27],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_7)

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [34])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
             (char (*) [2])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [2])Args_3,(uint *)Args_4,(char (*) [27])Args_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}